

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::
CoapTest_CoapMessagePayload_NonEmptyPayloadSerializationAndDeserialization_Test::
~CoapTest_CoapMessagePayload_NonEmptyPayloadSerializationAndDeserialization_Test
          (CoapTest_CoapMessagePayload_NonEmptyPayloadSerializationAndDeserialization_Test *this)

{
  CoapTest_CoapMessagePayload_NonEmptyPayloadSerializationAndDeserialization_Test *this_local;
  
  ~CoapTest_CoapMessagePayload_NonEmptyPayloadSerializationAndDeserialization_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(CoapTest, CoapMessagePayload_NonEmptyPayloadSerializationAndDeserialization)
{
    ByteArray buffer;
    Error     error;

    Message message{Type::kConfirmable, Code::kDelete};
    message.Append("hello");
    EXPECT_EQ(message.Serialize(buffer), ErrorCode::kNone);

    auto msg = Message::Deserialize(error, buffer);

    EXPECT_NE(msg, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);
    EXPECT_EQ(msg->GetPayloadAsString(), "hello");
}